

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

void Wlc_ObjSetCi(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  Wlc_Obj_t *pWVar3;
  int *piVar4;
  long lVar5;
  int iVar6;
  
  if ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3d) != (undefined1  [24])0x1)
  {
    __assert_fail("Wlc_ObjIsCi(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcNtk.c"
                  ,0x7c,"void Wlc_ObjSetCi(Wlc_Ntk_t *, Wlc_Obj_t *)");
  }
  if (pObj->nFanins != 0) {
    __assert_fail("Wlc_ObjFaninNum(pObj) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcNtk.c"
                  ,0x7d,"void Wlc_ObjSetCi(Wlc_Ntk_t *, Wlc_Obj_t *)");
  }
  if ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3) == (undefined1  [24])0x1)
  {
    uVar1 = (p->vPis).nSize;
    if (uVar1 != (p->vCis).nSize) {
      if (((int)uVar1 < 0) || ((p->vCis).nSize < (int)uVar1)) {
        __assert_fail("iHere >= 0 && iHere <= p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x413,"void Vec_IntInsert(Vec_Int_t *, int, int)");
      }
      pWVar3 = p->pObjs;
      Vec_IntPush(&p->vCis,0);
      iVar2 = (p->vCis).nSize;
      iVar6 = iVar2 + -1;
      if ((int)uVar1 < iVar6) {
        piVar4 = (p->vCis).pArray;
        lVar5 = (long)iVar2 + -1;
        do {
          piVar4[lVar5] = piVar4[lVar5 + -1];
          lVar5 = lVar5 + -1;
        } while ((long)(ulong)uVar1 < lVar5);
        iVar6 = (int)lVar5;
      }
      (p->vCis).pArray[iVar6] = (int)((ulong)((long)pObj - (long)pWVar3) >> 3) * -0x55555555;
      if (0 < (p->vCis).nSize) {
        lVar5 = 0;
        do {
          iVar2 = (p->vCis).pArray[lVar5];
          if (((long)iVar2 < 1) || (p->nObjsAlloc <= iVar2)) {
            __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlc.h"
                          ,0xa9,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
          }
          p->pObjs[iVar2].field_9.Fanins[1] = (int)lVar5;
          lVar5 = lVar5 + 1;
        } while (lVar5 < (p->vCis).nSize);
      }
      goto LAB_0030c437;
    }
  }
  (pObj->field_9).Fanins[1] = (p->vCis).nSize;
  Vec_IntPush(&p->vCis,(int)((ulong)((long)pObj - (long)p->pObjs) >> 3) * -0x55555555);
LAB_0030c437:
  if ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) != (undefined1  [24])0x1)
  {
    return;
  }
  Vec_IntPush(&p->vPis,(int)((ulong)((long)pObj - (long)p->pObjs) >> 3) * -0x55555555);
  return;
}

Assistant:

void Wlc_ObjSetCi( Wlc_Ntk_t * p, Wlc_Obj_t * pObj )
{
    assert( Wlc_ObjIsCi(pObj) );
    assert( Wlc_ObjFaninNum(pObj) == 0 );
    if ( Wlc_NtkPiNum(p) == Wlc_NtkCiNum(p) || pObj->Type != WLC_OBJ_PI )
    {
        pObj->Fanins[1] = Vec_IntSize(&p->vCis);
        Vec_IntPush( &p->vCis, Wlc_ObjId(p, pObj) );
    }
    else // insert in the array of CI at the end of PIs
    {
        Wlc_Obj_t * pTemp; int i;
        Vec_IntInsert( &p->vCis, Wlc_NtkPiNum(p), Wlc_ObjId(p, pObj) );
        // other CI IDs are invalidated... naive fix!
        Wlc_NtkForEachCi( p, pTemp, i )
            pTemp->Fanins[1] = i;
    }
    if ( pObj->Type == WLC_OBJ_PI )
        Vec_IntPush( &p->vPis, Wlc_ObjId(p, pObj) );
}